

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int parse_int(int *out,char **str)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  
  *out = 0;
  pcVar3 = *str;
  iVar2 = -1;
  if (0xf5 < (byte)(*pcVar3 - 0x3aU)) {
    uVar1 = (uint)(byte)(*pcVar3 - 0x30);
    *str = pcVar3 + 1;
    cVar4 = pcVar3[1];
    if (0xf5 < (byte)(cVar4 - 0x3aU)) {
      pcVar3 = pcVar3 + 2;
      do {
        uVar1 = (uint)(byte)(cVar4 - 0x30) + uVar1 * 10;
        *str = pcVar3;
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (0xf5 < (byte)(cVar4 - 0x3aU));
    }
    *out = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int parse_int(int *out, const char **str)
{
	int i = 0;
	*out = 0;
	if(**str < '0' || **str > '9')
		return -1;

	i = **str - '0';
	(*str)++;

	while(1)
	{
		if(**str < '0' || **str > '9')
		{
			*out = i;
			return 0;
		}

		i = (i*10) + (**str - '0');
		(*str)++;
	}

	return 0;
}